

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  size_type sVar2;
  long *plVar3;
  uint uVar4;
  size_t ilhs;
  MatchResultListener *pMVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  size_type __n;
  bool bVar9;
  char *sep;
  vector<char,_std::allocator<char>_> element_matched;
  vector<char,_std::allocator<char>_> matcher_matched;
  char *local_80;
  char *local_78;
  ulong local_70;
  _Vector_base<char,_std::allocator<char>_> local_68;
  _Vector_base<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  __n = *(size_type *)matrix;
  sVar2 = *(size_type *)(matrix + 8);
  bVar8 = true;
  if (__n != 0 || sVar2 != 0) {
    bVar8 = __n == sVar2 || *(int *)this != 3;
    local_38 = element_printouts;
    if (__n != 0 && (__n != sVar2 && *(int *)this == 3)) {
      if (listener->stream_ != (ostream *)0x0) {
        pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
        Elements((UnorderedElementsAreMatcherImplBase *)&local_68,*(size_t *)matrix);
        pMVar5 = MatchResultListener::operator<<(pMVar5,(Message *)&local_68);
        MatchResultListener::operator<<(pMVar5,(char (*) [2])0x50c738);
        if ((long *)local_68._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
          (**(code **)(*(long *)local_68._M_impl.super__Vector_impl_data._M_start + 8))();
        }
        __n = *(size_type *)matrix;
      }
      bVar8 = false;
    }
    local_50._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_68,__n,(value_type *)&local_50,
               (allocator_type *)&local_78);
    local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_50,*(size_type *)(matrix + 8),
               (value_type *)&local_78,(allocator_type *)&local_80);
    for (uVar6 = 0; uVar6 < *(ulong *)matrix; uVar6 = uVar6 + 1) {
      for (uVar7 = 0; uVar7 < *(ulong *)(matrix + 8); uVar7 = uVar7 + 1) {
        bVar9 = *(char *)(uVar7 + *(ulong *)(matrix + 8) * uVar6 + *(long *)(matrix + 0x10)) ==
                '\x01';
        *(byte *)((long)local_68._M_impl.super__Vector_impl_data._M_start + uVar6) =
             *(byte *)((long)local_68._M_impl.super__Vector_impl_data._M_start + uVar6) | bVar9;
        pbVar1 = (byte *)(CONCAT71(local_50._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_50._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar7)
        ;
        *pbVar1 = *pbVar1 | bVar9;
      }
    }
    uVar4 = *(uint *)this;
    if ((uVar4 & 1) != 0) {
      local_78 = "where the following matchers don\'t match any elements:\n";
      local_80 = (char *)0x0;
      while( true ) {
        if (local_50._M_impl.super__Vector_impl_data._M_finish +
            -CONCAT71(local_50._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_50._M_impl.super__Vector_impl_data._M_start._0_1_) <= local_80) break;
        if (local_80[CONCAT71(local_50._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_50._M_impl.super__Vector_impl_data._M_start._0_1_)] == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar5 = MatchResultListener::operator<<(listener,&local_78);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x5093db);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&local_80);
            MatchResultListener::operator<<(pMVar5,(char (*) [3])0x526882);
            plVar3 = *(long **)(*(long *)(this + 8) + (long)local_80 * 8);
            (**(code **)(*plVar3 + 0x10))(plVar3,listener->stream_);
            local_78 = ",\n";
          }
          bVar8 = false;
        }
        local_80 = local_80 + 1;
      }
      uVar4 = *(uint *)this;
    }
    if ((uVar4 & 2) != 0) {
      local_80 = "\nand ";
      if (bVar8 != false) {
        local_80 = "";
      }
      local_78 = "where the following elements don\'t match any matchers:\n";
      local_70 = 0;
      while( true ) {
        if ((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_68._M_impl.super__Vector_impl_data._M_start) <= local_70) break;
        if (*(char *)((long)local_68._M_impl.super__Vector_impl_data._M_start + local_70) == '\0') {
          if (listener->stream_ != (ostream *)0x0) {
            pMVar5 = MatchResultListener::operator<<(listener,&local_80);
            pMVar5 = MatchResultListener::operator<<(pMVar5,&local_78);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [10])0x50918a);
            pMVar5 = MatchResultListener::operator<<(pMVar5,&local_70);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [3])0x526882);
            MatchResultListener::operator<<
                      (pMVar5,(local_38->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + local_70);
            local_78 = ",\n";
            local_80 = "";
          }
          bVar8 = false;
        }
        local_70 = local_70 + 1;
      }
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_50);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
  }
  return bVar8;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  if (matrix.LhsSize() == 0 && matrix.RhsSize() == 0) {
    return true;
  }

  const bool is_exact_match_with_size_discrepency =
      match_flags() == UnorderedMatcherRequire::ExactMatch &&
      matrix.LhsSize() != matrix.RhsSize();
  if (is_exact_match_with_size_discrepency) {
    // The element count doesn't match.  If the container is empty,
    // there's no need to explain anything as Google Mock already
    // prints the empty container. Otherwise we just need to show
    // how many elements there actually are.
    if (matrix.LhsSize() != 0 && listener->IsInterested()) {
      *listener << "which has " << Elements(matrix.LhsSize()) << "\n";
    }
  }

  bool result = !is_exact_match_with_size_discrepency;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}